

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryEncoder.cc
# Opt level: O2

void __thiscall avro::BinaryEncoder::encodeString(BinaryEncoder *this,string *s)

{
  doEncodeLong(this,s->_M_string_length);
  StreamWriter::writeBytes(&this->out_,(uint8_t *)(s->_M_dataplus)._M_p,s->_M_string_length);
  return;
}

Assistant:

void BinaryEncoder::encodeString(const std::string& s)
{
    doEncodeLong(s.size());
    out_.writeBytes(reinterpret_cast<const uint8_t*>(s.c_str()), s.size());
}